

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_t __n;
  iterator __position;
  pointer pLVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  pointer this_00;
  int dependee_index;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  bool local_91;
  _Rb_tree_color local_90;
  int local_8c;
  cmListFileBacktrace local_88;
  vector<int,std::allocator<int>> *local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pcVar2 = (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_8c = depender_index;
  p_Var7 = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (this_00 != pcVar2) {
    local_70 = (vector<int,std::allocator<int>> *)&this->OriginalEntries;
    local_68 = (ulong)(uint)depender_index * 0x18;
    do {
      psVar5 = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      __n = psVar5->_M_string_length;
      if (((__n != psVar6->_M_string_length) ||
          ((__n != 0 &&
           (iVar4 = bcmp((psVar5->_M_dataplus)._M_p,(psVar6->_M_dataplus)._M_p,__n), iVar4 != 0))))
         && (psVar5 = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem),
            psVar5->_M_string_length != 0)) {
        local_90 = AddLinkEntry(this,&this_00->super_cmLinkItem);
        if (local_8c < 0) {
          __position._M_current =
               (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_70,__position,(int *)&local_90);
            p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            *__position._M_current = local_90;
            (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
            p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          }
        }
        else {
          local_91 = false;
          local_88.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_88.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((long)&(((this->EntryConstraintGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> +
                     local_68),(int *)&local_90,&local_91,&local_88);
          p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_88.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
            p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          }
        }
        for (; (_Rb_tree_header *)p_Var7 != p_Var1;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          pLVar3 = (this->EntryList).
                   super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((pLVar3[(int)local_90].Target == (cmGeneratorTarget *)0x0) &&
              (pLVar3[(int)local_90].IsFlag == false)) && (local_90 != p_Var7[1]._M_color)) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &p_Var7[1]._M_parent,(int *)&local_90);
          }
        }
        if ((this->InferredDependSets).
            super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
            ._M_impl.super__Vector_impl_data._M_start[(int)local_90] != (DependSetList *)0x0) {
          std::
          map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
          ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                        *)&local_60,(key_type_conflict *)&local_90);
        }
      }
      this_00 = this_00 + 1;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (this_00 != pcVar2);
  }
  for (; (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(&(this->InferredDependSets).
               super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color]->
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ,(value_type *)&p_Var7[1]._M_parent);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    // Add a link entry for this item.
    int dependee_index = this->AddLinkEntry(l);

    // The dependee must come after the depender.
    if (depender_index >= 0) {
      this->EntryConstraintGraph[depender_index].emplace_back(
        dependee_index, false, cmListFileBacktrace());
    } else {
      // This is a direct dependency of the target being linked.
      this->OriginalEntries.push_back(dependee_index);
    }

    // Update the inferred dependencies for earlier items.
    for (auto& dependSet : dependSets) {
      // Add this item to the inferred dependencies of other items.
      // Target items are never inferred dependees because unknown
      // items are outside libraries that should not be depending on
      // targets.
      if (!this->EntryList[dependee_index].Target &&
          !this->EntryList[dependee_index].IsFlag &&
          dependee_index != dependSet.first) {
        dependSet.second.insert(dependee_index);
      }
    }

    // If this item needs to have dependencies inferred, do so.
    if (this->InferredDependSets[dependee_index]) {
      // Make sure an entry exists to hold the set for the item.
      dependSets[dependee_index];
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first]->push_back(dependSet.second);
  }
}